

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFile.h
# Opt level: O1

TextFile * __thiscall asl::TextFile::operator<<(TextFile *this,char *x)

{
  void *in_RDX;
  undefined8 local_20;
  char local_18;
  undefined1 uStack_17;
  undefined6 uStack_16;
  
  local_18 = *x;
  local_20 = 0x100000000;
  uStack_17 = 0;
  write(this,(int)&local_20,in_RDX,0x100000000);
  if ((int)local_20 != 0) {
    free((void *)CONCAT62(uStack_16,CONCAT11(uStack_17,local_18)));
  }
  return this;
}

Assistant:

TextFile& operator<<(const T& x) { write(String(x)); return *this; }